

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::applyCommandLine(Context *this,int argc,char **argv)

{
  String local_38;
  char **local_20;
  char **argv_local;
  Context *pCStack_10;
  int argc_local;
  Context *this_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  parseArgs(this,argc,argv,false);
  if (argv_local._4_4_ != 0) {
    String::String(&local_38,*local_20);
    String::operator=(&(this->p->super_ContextOptions).binary_name,&local_38);
    String::~String(&local_38);
  }
  return;
}

Assistant:

void Context::applyCommandLine(int argc, const char* const* argv) {
    parseArgs(argc, argv);
    if(argc)
        p->binary_name = argv[0];
}